

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS
extract_displaced_xyz(REF_NODE ref_node,REF_INT *ldim,REF_DBL **initial_field,REF_DBL **displaced)

{
  int iVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  REF_STATUS RVar5;
  REF_DBL *pRVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  uVar12 = (ulong)(uint)ref_node->max;
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xb0d,"extract_displaced_xyz","malloc *displaced of REF_DBL negative");
    RVar5 = 1;
  }
  else {
    pRVar6 = (REF_DBL *)malloc(uVar12 * 0x18);
    *displaced = pRVar6;
    if (pRVar6 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xb0d,"extract_displaced_xyz","malloc *displaced of REF_DBL NULL");
    }
    else {
      if (uVar12 != 0) {
        pRVar3 = ref_node->global;
        lVar7 = 0;
        uVar8 = 0;
        do {
          if (-1 < pRVar3[uVar8]) {
            iVar1 = *ldim;
            pRVar4 = *initial_field;
            lVar11 = 0;
            do {
              pRVar6[lVar11] = *(REF_DBL *)((long)pRVar4 + lVar11 * 8 + iVar1 * lVar7);
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
          }
          uVar8 = uVar8 + 1;
          pRVar6 = pRVar6 + 3;
          lVar7 = lVar7 + 8;
        } while (uVar8 != uVar12);
      }
      iVar1 = *ldim;
      uVar9 = iVar1 - 3;
      *ldim = uVar9;
      iVar2 = ref_node->max;
      if (0 < (long)iVar2) {
        pRVar3 = ref_node->global;
        iVar10 = 3;
        lVar7 = 0;
        lVar11 = 0;
        do {
          if (-1 < pRVar3[lVar11] && 3 < iVar1) {
            pRVar6 = *initial_field;
            uVar12 = 0;
            do {
              *(REF_DBL *)((long)pRVar6 + uVar12 * 8 + lVar7) = pRVar6[iVar10 + (int)uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar9 != uVar12);
          }
          lVar11 = lVar11 + 1;
          lVar7 = lVar7 + (long)(int)uVar9 * 8;
          iVar10 = iVar10 + iVar1;
        } while (lVar11 != iVar2);
      }
      fflush(_stdout);
      uVar9 = ref_node->max * *ldim;
      if (0 < (int)uVar9) {
        pRVar6 = (REF_DBL *)realloc(*initial_field,(ulong)uVar9 << 3);
        *initial_field = pRVar6;
      }
      if (*initial_field != (REF_DBL *)0x0) {
        return 0;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xb1a,"extract_displaced_xyz","realloc *initial_field NULL");
      uVar12 = (long)ref_node->max * (long)*ldim;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar12 & 0xffffffff,uVar12,8
             ,uVar12 * 8);
    }
    RVar5 = 2;
  }
  return RVar5;
}

Assistant:

static REF_STATUS extract_displaced_xyz(REF_NODE ref_node, REF_INT *ldim,
                                        REF_DBL **initial_field,
                                        REF_DBL **displaced) {
  REF_INT i, node;

  ref_malloc(*displaced, 3 * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 3; i++) {
      (*displaced)[i + 3 * node] = (*initial_field)[i + (*ldim) * node];
    }
  }
  (*ldim) -= 3;
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < (*ldim); i++) {
      (*initial_field)[i + (*ldim) * node] =
          (*initial_field)[i + 3 + ((*ldim) + 3) * node];
    }
  }
  ref_realloc(*initial_field, (*ldim) * ref_node_max(ref_node), REF_DBL);
  return REF_SUCCESS;
}